

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterial_translucent(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParamSet *pPVar2;
  string *name;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  SP SVar8;
  SP SVar9;
  SP mat;
  string local_88;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [40];
  
  local_68 = (element_type *)0x0;
  local_58._16_8_ = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::TranslucentMaterial,std::allocator<pbrt::TranslucentMaterial>,std::__cxx11::string&>
            (&_Stack_60,(TranslucentMaterial **)&local_68,
             (allocator<pbrt::TranslucentMaterial> *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  std::__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::TranslucentMaterial,pbrt::TranslucentMaterial>
            ((__shared_ptr<pbrt::TranslucentMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (TranslucentMaterial *)local_68);
  peVar3 = local_68;
  pPVar2 = (ParamSet *)*in_RDX;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"transmit","");
  syntactic::ParamSet::getParam3f
            (pPVar2,(float *)&(peVar3->film).
                              super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_68;
  pPVar2 = (ParamSet *)*in_RDX;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"reflect","");
  syntactic::ParamSet::getParam3f
            (pPVar2,(float *)((long)&(peVar3->sampler).
                                     super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr + 4),&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (ParamSet *)*in_RDX;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Kd","");
  bVar6 = syntactic::ParamSet::hasParamTexture(pPVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_68;
  if (bVar6) {
    name = (string *)*in_RDX;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Kd","");
    syntactic::ParamSet::getParamTexture((ParamSet *)(local_58 + 0x18),name);
    SVar8 = findOrCreateTexture((SemanticParser *)local_58,(SP *)in);
    uVar5 = local_58._8_8_;
    uVar4 = local_58._0_8_;
    _Var7 = SVar8.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (local_68->pixelFilter).
              super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (local_68->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)uVar4;
    (local_68->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var7._M_pi = extraout_RDX;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      _Var7._M_pi = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  else {
    pPVar2 = (ParamSet *)*in_RDX;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Kd","");
    syntactic::ParamSet::getParam3f(pPVar2,(float *)&peVar3->integrator,&local_88);
    _Var7._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    _Var7._M_pi = extraout_RDX_03;
  }
  (((SP *)local_58._16_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((SP *)local_58._16_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       local_68;
  (((SP *)local_58._16_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = _Stack_60._M_pi;
  SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._16_8_;
  return (SP)SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_translucent(pbrt::syntactic::Material::SP in)
  {
    TranslucentMaterial::SP mat = std::make_shared<TranslucentMaterial>(in->name);

    in->getParam3f(&mat->transmit.x,"transmit");
    in->getParam3f(&mat->reflect.x,"reflect");
    if (in->hasParamTexture("Kd"))
      mat->map_kd = findOrCreateTexture(in->getParamTexture("Kd"));
    else
      in->getParam3f(&mat->kd.x,"Kd");
          
    return mat;
  }